

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simMan.c
# Opt level: O2

void Sym_ManStop(Sym_Man_t *p)

{
  long lVar1;
  
  Sym_ManPrintStats(p);
  if (p->vSuppFun != (Vec_Ptr_t *)0x0) {
    Sim_UtilInfoFree(p->vSuppFun);
  }
  if (p->vSim != (Vec_Ptr_t *)0x0) {
    Sim_UtilInfoFree(p->vSim);
  }
  if (p->vNodes != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vNodes);
  }
  if (p->vSupports != (Vec_Vec_t *)0x0) {
    Vec_VecFree(p->vSupports);
  }
  for (lVar1 = 0; lVar1 < p->nOutputs; lVar1 = lVar1 + 1) {
    Extra_BitMatrixStop((Extra_BitMat_t *)p->vMatrSymms->pArray[lVar1]);
    Extra_BitMatrixStop((Extra_BitMat_t *)p->vMatrNonSymms->pArray[lVar1]);
  }
  Vec_IntFree(p->vVarsU);
  Vec_IntFree(p->vVarsV);
  Vec_PtrFree(p->vMatrSymms);
  Vec_PtrFree(p->vMatrNonSymms);
  Vec_IntFree(p->vPairsTotal);
  Vec_IntFree(p->vPairsSym);
  Vec_IntFree(p->vPairsNonSym);
  if (p->uPatRand != (uint *)0x0) {
    free(p->uPatRand);
    p->uPatRand = (uint *)0x0;
  }
  if (p->uPatCol != (uint *)0x0) {
    free(p->uPatCol);
    p->uPatCol = (uint *)0x0;
  }
  free(p->uPatRow);
  free(p);
  return;
}

Assistant:

void Sym_ManStop( Sym_Man_t * p )
{
    int i;
    Sym_ManPrintStats( p );
    if ( p->vSuppFun )     Sim_UtilInfoFree( p->vSuppFun );   
    if ( p->vSim )         Sim_UtilInfoFree( p->vSim );   
    if ( p->vNodes )       Vec_PtrFree( p->vNodes );
    if ( p->vSupports )    Vec_VecFree( p->vSupports );
    for ( i = 0; i < p->nOutputs; i++ )
    {
        Extra_BitMatrixStop( (Extra_BitMat_t *)p->vMatrSymms->pArray[i] );
        Extra_BitMatrixStop( (Extra_BitMat_t *)p->vMatrNonSymms->pArray[i] );
    }
    Vec_IntFree( p->vVarsU );
    Vec_IntFree( p->vVarsV );
    Vec_PtrFree( p->vMatrSymms );
    Vec_PtrFree( p->vMatrNonSymms );
    Vec_IntFree( p->vPairsTotal );
    Vec_IntFree( p->vPairsSym );
    Vec_IntFree( p->vPairsNonSym );
    ABC_FREE( p->uPatRand );
    ABC_FREE( p->uPatCol );
    ABC_FREE( p->uPatRow );
    ABC_FREE( p );
}